

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidgetPrivate::setScreen(QWidgetPrivate *this,QScreen *screen)

{
  QWExtra *pQVar1;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var2;
  int *piVar3;
  QScreen *pQVar4;
  undefined8 uVar5;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var6;
  bool bVar7;
  
  if ((screen == (QScreen *)0x0) ||
     ((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 0xc) & 1) == 0)) {
    bVar7 = false;
  }
  else {
    pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar1 == (QWExtra *)0x0) {
      _Var6._M_head_impl = (QTLWExtra *)0x0;
    }
    else {
      _Var6._M_head_impl =
           *(QTLWExtra **)
            &(pQVar1->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    }
    if (((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var6._M_head_impl ==
         (QTLWExtra *)0x0) || (*(long *)((long)_Var6._M_head_impl + 0x20) == 0)) {
      pQVar4 = (QScreen *)0x0;
    }
    else {
      pQVar4 = (QScreen *)QWindow::screen();
    }
    bVar7 = pQVar4 != screen;
    if (bVar7) {
      createTLExtra(this);
      _Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)screen);
      piVar3 = *(int **)((long)_Var2.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
      *(undefined8 *)
       ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar5;
      *(QScreen **)
       ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = screen;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          operator_delete(piVar3);
        }
      }
      pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (pQVar1 == (QWExtra *)0x0) {
        _Var6._M_head_impl = (QTLWExtra *)0x0;
      }
      else {
        _Var6._M_head_impl =
             *(QTLWExtra **)
              &(pQVar1->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      }
      bVar7 = true;
      if (((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var6._M_head_impl !=
           (QTLWExtra *)0x0) && (*(long *)((long)_Var6._M_head_impl + 0x20) != 0)) {
        QWindow::setScreen(*(QScreen **)
                            ((long)(pQVar1->topextra)._M_t.
                                   super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
                            + 0x20));
      }
    }
  }
  return bVar7;
}

Assistant:

bool QWidgetPrivate::setScreen(QScreen *screen)
{
    Q_Q(QWidget);
    if (!screen || !q->isWindow())
        return false;
    const QScreen *currentScreen = windowHandle() ? windowHandle()->screen() : nullptr;
    if (currentScreen != screen) {
        topData()->initialScreen = screen;
        if (windowHandle())
            windowHandle()->setScreen(screen);
        return true;
    }
    return false;
}